

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__decode_uint16_linear_AR(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 (*pauVar7) [16];
  ushort *puVar8;
  float *decode;
  float *pfVar9;
  float *pfVar10;
  undefined1 (*pauVar11) [16];
  float *pfVar12;
  
  pfVar1 = decodep + width_times_channels;
  if (width_times_channels < 8) {
    pfVar9 = decodep;
    if (3 < width_times_channels) {
      do {
        decodep = pfVar9 + 4;
        *pfVar9 = (float)*(ushort *)((long)inputp + 2);
        pfVar9[1] = (float)*inputp;
        pfVar9[2] = (float)*(ushort *)((long)inputp + 6);
        pfVar9[3] = (float)*(ushort *)((long)inputp + 4);
        inputp = (void *)((long)inputp + 8);
        pfVar10 = pfVar9 + 8;
        pfVar9 = decodep;
      } while (pfVar10 <= pfVar1);
    }
    if (decodep < pfVar1) {
      puVar8 = (ushort *)((long)inputp + 2);
      do {
        *decodep = (float)*puVar8;
        decodep[1] = (float)puVar8[-1];
        decodep = decodep + 2;
        puVar8 = puVar8 + 2;
      } while (decodep < pfVar1);
    }
  }
  else {
    pfVar9 = pfVar1 + -8;
    pauVar7 = (undefined1 (*) [16])inputp;
    do {
      pfVar10 = decodep + 8;
      pfVar12 = pfVar9;
      pauVar11 = (undefined1 (*) [16])((long)inputp + (long)width_times_channels * 2 + -0x10);
      if (pfVar10 == pfVar1) {
        pfVar12 = pfVar10;
        pauVar11 = pauVar7 + 1;
      }
      if (pfVar10 <= pfVar9) {
        pauVar11 = pauVar7 + 1;
      }
      auVar2 = *pauVar7;
      if (pfVar10 <= pfVar9) {
        pfVar12 = pfVar10;
      }
      auVar3._10_2_ = 0;
      auVar3._0_10_ = auVar2._0_10_;
      auVar3._12_2_ = auVar2._6_2_;
      auVar4._8_2_ = auVar2._4_2_;
      auVar4._0_8_ = auVar2._0_8_;
      auVar4._10_4_ = auVar3._10_4_;
      auVar6._6_8_ = 0;
      auVar6._0_6_ = auVar4._8_6_;
      auVar5._4_2_ = auVar2._2_2_;
      auVar5._0_4_ = auVar2._0_4_;
      auVar5._6_8_ = SUB148(auVar6 << 0x40,6);
      *decodep = (float)auVar5._4_4_;
      decodep[1] = (float)(auVar2._0_4_ & 0xffff);
      decodep[2] = (float)(auVar3._10_4_ >> 0x10);
      decodep[3] = (float)auVar4._8_4_;
      decodep[4] = (float)auVar2._10_2_;
      decodep[5] = (float)auVar2._8_2_;
      decodep[6] = (float)auVar2._14_2_;
      decodep[7] = (float)auVar2._12_2_;
      pauVar7 = pauVar11;
      decodep = pfVar12;
    } while (pfVar10 != pfVar1);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_uint16_linear)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned short const * input = (unsigned short const *)inputp;

  #ifdef STBIR_SIMD
  unsigned short const * end_input_m8 = input + width_times_channels - 8;
  if ( width_times_channels >= 8 )
  {
    decode_end -= 8;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o;
      stbir__simdf8 of;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u16_to_u32( o, i );
      stbir__simdi8_convert_i32_to_float( of, o );
      stbir__decode_simdf8_flip( of );
      stbir__simdf8_store( decode + 0, of );
      #else
      stbir__simdi i, o0, o1;
      stbir__simdf of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u16_to_u32( o0, o1, i );
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      #endif
      decode += 8;
      input += 8;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 8 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0]));
    decode[1-4] = ((float)(input[stbir__decode_order1]));
    decode[2-4] = ((float)(input[stbir__decode_order2]));
    decode[3-4] = ((float)(input[stbir__decode_order3]));
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0]));
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1]));
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2]));
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}